

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O0

Error * ot::commissioner::cose::MakeCoseKey
                  (Error *__return_storage_ptr__,ByteArray *aEncodedCoseKey,mbedtls_pk_context *aKey
                  ,ByteArray *aKeyId)

{
  cn_cbor_type cVar1;
  mbedtls_pk_context pk;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  Error *pEVar7;
  uchar *aBytes;
  size_type aLength;
  size_t aLength_00;
  v10 *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar8;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  undefined8 in_stack_fffffffffffff670;
  ErrorCode local_8e4;
  Error local_8e0;
  ErrorCode local_8b4;
  Error local_8b0;
  Error local_888;
  int local_860;
  ErrorCode local_85c;
  int fail_1;
  Error local_830;
  int local_808;
  ErrorCode local_804;
  int fail;
  undefined1 local_7d8 [7];
  v10 local_7d1;
  undefined8 local_7d0;
  char *local_7c8;
  string local_7c0;
  Error local_7a0;
  undefined4 local_774;
  Error local_770;
  ErrorCode local_744;
  Error local_740;
  ErrorCode local_714;
  Error local_710;
  anon_class_1_0_00000001 local_6e2;
  v10 local_6e1;
  v10 *local_6e0;
  size_t local_6d8;
  string local_6d0;
  Error local_6b0;
  mbedtls_pk_info_t *local_688;
  void *pvStack_680;
  undefined8 local_678;
  size_t local_670;
  size_t encodedCoseKeyLength;
  uint8_t encodedCoseKey [1024];
  size_t yLength;
  uint8_t yPoint [65];
  size_t xLength;
  uint8_t xPoint [65];
  int ec2Curve;
  undefined1 local_1b0 [8];
  CborMap coseKey;
  mbedtls_ecp_keypair *eckey;
  ByteArray *aKeyId_local;
  mbedtls_pk_context *aKey_local;
  ByteArray *aEncodedCoseKey_local;
  Error *error;
  undefined1 local_150 [16];
  v10 *local_140;
  ulong local_138;
  v10 *local_130;
  size_t sStack_128;
  string *local_120;
  v10 *local_118;
  v10 **local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_108 [3];
  undefined1 local_f0 [16];
  v10 *local_e0;
  char *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> *local_d0;
  v10 *local_c8;
  char *pcStack_c0;
  string *local_b8;
  v10 *local_b0;
  undefined8 *local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  Error **local_80;
  undefined1 *local_78;
  Error **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int> **local_10;
  
  Error::Error(__return_storage_ptr__);
  CborMap::CborMap((CborMap *)local_1b0);
  iVar6 = mbedtls_pk_can_do(aKey,MBEDTLS_PK_ECDSA);
  if (iVar6 != 0) {
    local_678 = *(undefined8 *)&aKey->priv_id;
    local_688 = aKey->pk_info;
    pvStack_680 = aKey->pk_ctx;
    uVar2 = aKey->pk_ctx;
    uVar3 = aKey->priv_id;
    uVar4 = *(undefined4 *)&aKey->field_0x14;
    pk.pk_ctx._4_4_ = uVar4;
    pk.pk_ctx._0_4_ = uVar3;
    pk.pk_info = (mbedtls_pk_info_t *)uVar2;
    pk._16_8_ = in_stack_fffffffffffff670;
    coseKey.super_CborValue.mCbor = (cn_cbor *)mbedtls_pk_ec(pk);
    if ((mbedtls_ecp_keypair *)coseKey.super_CborValue.mCbor != (mbedtls_ecp_keypair *)0x0) {
      CborMap::Init(&local_710,(CborMap *)local_1b0);
      pEVar7 = Error::operator=(__return_storage_ptr__,&local_710);
      local_714 = kNone;
      bVar5 = commissioner::operator!=(pEVar7,&local_714);
      Error::~Error(&local_710);
      if (!bVar5) {
        bVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(aKeyId);
        if (!bVar5) {
          aBytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(aKeyId);
          aLength = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aKeyId);
          CborMap::Put(&local_740,(CborMap *)local_1b0,2,aBytes,aLength);
          pEVar7 = Error::operator=(__return_storage_ptr__,&local_740);
          local_744 = kNone;
          bVar5 = commissioner::operator!=(pEVar7,&local_744);
          Error::~Error(&local_740);
          if (bVar5) goto LAB_0030b691;
        }
        CborMap::Put(&local_770,(CborMap *)local_1b0,1,2);
        pEVar7 = Error::operator=(__return_storage_ptr__,&local_770);
        local_774 = 0;
        this = (v10 *)&local_774;
        bVar5 = commissioner::operator!=(pEVar7,(ErrorCode *)this);
        Error::~Error(&local_770);
        if (!bVar5) {
          cVar1 = (coseKey.super_CborValue.mCbor)->type;
          if (cVar1 == CN_CBOR_UNDEF) {
            stack0xfffffffffffffe40 = 1;
          }
          else if (cVar1 == CN_CBOR_UINT) {
            stack0xfffffffffffffe40 = 2;
          }
          else {
            if (cVar1 != CN_CBOR_INT) {
              MakeCoseKey::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(local_7d8 + 6));
              local_a8 = &local_7d0;
              local_b0 = &local_7d1;
              bVar8 = ::fmt::v10::operator()(local_b0);
              local_7c8 = (char *)bVar8.size_;
              local_7d0 = bVar8.data_;
              ::fmt::v10::detail::check_format_string<int,_FMT_COMPILE_STRING,_0>();
              local_7d8._0_4_ = (coseKey.super_CborValue.mCbor)->type;
              local_b8 = &local_7c0;
              local_c8 = (v10 *)local_7d0;
              pcStack_c0 = local_7c8;
              local_d0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_int>
                          *)local_7d8;
              local_50 = &local_c8;
              local_e0 = (v10 *)local_7d0;
              local_d8 = local_7c8;
              local_48 = local_e0;
              pcStack_40 = local_d8;
              local_108[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                                       (local_d0,this,(int *)local_b8);
              local_30 = local_f0;
              local_38 = local_108;
              local_20 = 1;
              args_00.field_1.values_ = in_R9.values_;
              args_00.desc_ = (unsigned_long_long)local_38;
              fmt_00.size_ = 1;
              fmt_00.data_ = local_d8;
              local_28 = local_38;
              local_18 = local_30;
              local_10 = local_38;
              ::fmt::v10::vformat_abi_cxx11_(&local_7c0,local_e0,fmt_00,args_00);
              Error::Error(&local_7a0,kInvalidArgs,&local_7c0);
              Error::operator=(__return_storage_ptr__,&local_7a0);
              Error::~Error(&local_7a0);
              std::__cxx11::string::~string((string *)&local_7c0);
              goto LAB_0030b691;
            }
            stack0xfffffffffffffe40 = 3;
          }
          CborMap::Put((Error *)&fail,(CborMap *)local_1b0,-1,stack0xfffffffffffffe40);
          pEVar7 = Error::operator=(__return_storage_ptr__,(Error *)&fail);
          local_804 = kNone;
          bVar5 = commissioner::operator!=(pEVar7,&local_804);
          Error::~Error((Error *)&fail);
          if (!bVar5) {
            local_808 = mbedtls_mpi_write_binary
                                  ((mbedtls_mpi *)&coseKey.super_CborValue.mCbor[3].next,
                                   (uchar *)&xLength,0x41);
            if (local_808 == 0) {
              register0x00000000 =
                   mbedtls_mpi_size((mbedtls_mpi *)&coseKey.super_CborValue.mCbor[3].next);
              CborMap::Put((Error *)&fail_1,(CborMap *)local_1b0,-2,
                           xPoint + (0x39 - register0x00000000),register0x00000000);
              pEVar7 = Error::operator=(__return_storage_ptr__,(Error *)&fail_1);
              local_85c = kNone;
              bVar5 = commissioner::operator!=(pEVar7,&local_85c);
              Error::~Error((Error *)&fail_1);
              if (!bVar5) {
                local_860 = mbedtls_mpi_write_binary
                                      ((mbedtls_mpi *)(coseKey.super_CborValue.mCbor + 4),
                                       (uchar *)&yLength,0x41);
                if (local_860 == 0) {
                  aLength_00 = mbedtls_mpi_size((mbedtls_mpi *)(coseKey.super_CborValue.mCbor + 4));
                  CborMap::Put(&local_8b0,(CborMap *)local_1b0,-3,yPoint + (0x39 - aLength_00),
                               aLength_00);
                  pEVar7 = Error::operator=(__return_storage_ptr__,&local_8b0);
                  local_8b4 = kNone;
                  bVar5 = commissioner::operator!=(pEVar7,&local_8b4);
                  Error::~Error(&local_8b0);
                  if (!bVar5) {
                    CborValue::Serialize
                              (&local_8e0,(CborValue *)local_1b0,(uint8_t *)&encodedCoseKeyLength,
                               &local_670,0x400);
                    pEVar7 = Error::operator=(__return_storage_ptr__,&local_8e0);
                    local_8e4 = kNone;
                    bVar5 = commissioner::operator!=(pEVar7,&local_8e4);
                    Error::~Error(&local_8e0);
                    if (!bVar5) {
                      std::vector<unsigned_char,std::allocator<unsigned_char>>::
                      assign<unsigned_char*,void>
                                ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                 aEncodedCoseKey,(uchar *)&encodedCoseKeyLength,
                                 encodedCoseKey + (local_670 - 8));
                    }
                  }
                }
                else {
                  ErrorFromMbedtlsError(&local_888,local_860);
                  Error::operator=(__return_storage_ptr__,&local_888);
                  Error::~Error(&local_888);
                }
              }
            }
            else {
              ErrorFromMbedtlsError(&local_830,local_808);
              Error::operator=(__return_storage_ptr__,&local_830);
              Error::~Error(&local_830);
            }
          }
        }
      }
      goto LAB_0030b691;
    }
  }
  MakeCoseKey::anon_class_1_0_00000001::operator()(&local_6e2);
  local_110 = &local_6e0;
  local_118 = &local_6e1;
  bVar8 = ::fmt::v10::operator()(local_118);
  local_6d8 = bVar8.size_;
  local_6e0 = (v10 *)bVar8.data_;
  ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
  local_120 = &local_6d0;
  local_130 = local_6e0;
  sStack_128 = local_6d8;
  local_a0 = &local_130;
  local_140 = local_6e0;
  local_138 = local_6d8;
  local_98 = local_140;
  sStack_90 = local_138;
  error = (Error *)::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
  local_78 = local_150;
  local_80 = &error;
  local_60 = 0;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_80;
  fmt.size_ = 0;
  fmt.data_ = (char *)local_138;
  local_70 = local_80;
  local_68 = local_80;
  local_58 = local_78;
  ::fmt::v10::vformat_abi_cxx11_(&local_6d0,local_140,fmt,args);
  Error::Error(&local_6b0,kInvalidArgs,&local_6d0);
  Error::operator=(__return_storage_ptr__,&local_6b0);
  Error::~Error(&local_6b0);
  std::__cxx11::string::~string((string *)&local_6d0);
LAB_0030b691:
  CborMap::~CborMap((CborMap *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

Error MakeCoseKey(ByteArray &aEncodedCoseKey, const mbedtls_pk_context &aKey, const ByteArray &aKeyId)
{
    static constexpr size_t kMaxCoseKeyLength = 1024;

    Error                             error;
    const struct mbedtls_ecp_keypair *eckey;
    CborMap                           coseKey;
    int                               ec2Curve;
    uint8_t                           xPoint[MBEDTLS_ECP_MAX_PT_LEN];
    size_t                            xLength;
    uint8_t                           yPoint[MBEDTLS_ECP_MAX_PT_LEN];
    size_t                            yLength;
    uint8_t                           encodedCoseKey[kMaxCoseKeyLength];
    size_t                            encodedCoseKeyLength;

    if (!mbedtls_pk_can_do(&aKey, MBEDTLS_PK_ECDSA) || (eckey = mbedtls_pk_ec(aKey)) == nullptr)
    {
        ExitNow(error = ERROR_INVALID_ARGS("Make COSE key without valid EC key"));
    }

    SuccessOrExit(error = coseKey.Init());

    // Cose key id('kid')
    if (!aKeyId.empty())
    {
        SuccessOrExit(error = coseKey.Put(kKeyId, aKeyId.data(), aKeyId.size()));
    }

    // Cose key type
    SuccessOrExit(error = coseKey.Put(kKeyType, kKeyTypeEC2));

    // Cose key EC2 curve
    switch (eckey->grp.id)
    {
    case MBEDTLS_ECP_DP_SECP256R1:
        ec2Curve = kKeyEC2CurveP256;
        break;
    case MBEDTLS_ECP_DP_SECP384R1:
        ec2Curve = kKeyEC2CurveP384;
        break;
    case MBEDTLS_ECP_DP_SECP521R1:
        ec2Curve = kKeyEC2CurveP521;
        break;
    default:
        ExitNow(error = ERROR_INVALID_ARGS("make COSE key with invalid EC2 curve group ID {}",
                                           static_cast<int>(eckey->grp.id)));
    }
    SuccessOrExit(error = coseKey.Put(kKeyEC2Curve, ec2Curve));

    // Cose key EC2 X
    if (int fail = mbedtls_mpi_write_binary(&eckey->Q.X, xPoint, sizeof(xPoint)))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    // 'mbedtls_mpi_write_binary' writes to the end of buffer
    xLength = mbedtls_mpi_size(&eckey->Q.X);
    SuccessOrExit(error = coseKey.Put(kKeyEC2X, xPoint + sizeof(xPoint) - xLength, xLength));

    // TODO(wgtdkp): handle the situation that Y point is not presented.
    // Cose key EC2 Y
    if (int fail = mbedtls_mpi_write_binary(&eckey->Q.Y, yPoint, sizeof(yPoint)))
    {
        ExitNow(error = ErrorFromMbedtlsError(fail));
    }

    yLength = mbedtls_mpi_size(&eckey->Q.Y);
    SuccessOrExit(error = coseKey.Put(kKeyEC2Y, yPoint + sizeof(yPoint) - yLength, yLength));

    SuccessOrExit(error = coseKey.Serialize(encodedCoseKey, encodedCoseKeyLength, sizeof(encodedCoseKey)));

    aEncodedCoseKey.assign(encodedCoseKey, encodedCoseKey + encodedCoseKeyLength);

exit:
    return error;
}